

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
 __thiscall
spvtools::
MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (spvtools *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *args)

{
  pointer puVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)::operator_new(0x18);
  puVar1 = (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *puVar2 = (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar2[1] = puVar1;
  puVar2[2] = (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}